

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src,bool before)

{
  bool bVar1;
  cmTargetInternals *pcVar2;
  cmTargetInternals *pcVar3;
  size_type sVar4;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_e8;
  const_iterator local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  const_iterator local_c8;
  undefined1 local_c0 [8];
  cmListFileBacktrace lfbt;
  TargetPropertyEntryFinder local_a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  undefined1 local_78 [8];
  cmSourceFileLocation sfl;
  bool before_local;
  string *src_local;
  cmTarget *this_local;
  
  sfl.Name.field_2._M_local_buf[0xf] = before;
  cmSourceFileLocation::cmSourceFileLocation
            ((cmSourceFileLocation *)local_78,this->Makefile,src,Known);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  local_88._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&pcVar2->SourceEntries);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  local_a0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&pcVar2->SourceEntries);
  TargetPropertyEntryFinder::TargetPropertyEntryFinder(&local_a8,(cmSourceFileLocation *)local_78);
  local_80 = std::
             find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,TargetPropertyEntryFinder>
                       (local_88,local_a0,local_a8);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  lfbt.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&pcVar2->SourceEntries);
  bVar1 = __gnu_cxx::operator==
                    (&local_80,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&lfbt.TopEntry.
                         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  if (bVar1) {
    cmMakefile::GetBacktrace((cmMakefile *)local_c0);
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    if ((sfl.Name.field_2._M_local_buf[0xf] & 1U) == 0) {
      pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
      local_d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pcVar3->SourceEntries);
    }
    else {
      pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
      local_d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pcVar3->SourceEntries);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_c8,&local_d0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(&pcVar2->SourceEntries,local_c8,src);
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    if ((sfl.Name.field_2._M_local_buf[0xf] & 1U) == 0) {
      pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
      local_e8._M_current =
           (cmListFileBacktrace *)
           std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                     (&pcVar3->SourceBacktraces);
    }
    else {
      pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
      local_e8._M_current =
           (cmListFileBacktrace *)
           std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::begin
                     (&pcVar3->SourceBacktraces);
    }
    __gnu_cxx::
    __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
    ::__normal_iterator<cmListFileBacktrace*>
              ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
                *)&local_e0,&local_e8);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::insert
              (&pcVar2->SourceBacktraces,local_e0,(value_type *)local_c0);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c0);
  }
  sVar4 = cmGeneratorExpression::Find(src);
  if (sVar4 == 0xffffffffffffffff) {
    this_local = (cmTarget *)cmMakefile::GetOrCreateSource(this->Makefile,src,false,Known);
  }
  else {
    this_local = (cmTarget *)0x0;
  }
  cmSourceFileLocation::~cmSourceFileLocation((cmSourceFileLocation *)local_78);
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src, bool before)
{
  cmSourceFileLocation sfl(this->Makefile, src,
                           cmSourceFileLocationKind::Known);
  if (std::find_if(this->Internal->SourceEntries.begin(),
                   this->Internal->SourceEntries.end(),
                   TargetPropertyEntryFinder(sfl)) ==
      this->Internal->SourceEntries.end()) {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.insert(
      before ? this->Internal->SourceEntries.begin()
             : this->Internal->SourceEntries.end(),
      src);
    this->Internal->SourceBacktraces.insert(
      before ? this->Internal->SourceBacktraces.begin()
             : this->Internal->SourceBacktraces.end(),
      lfbt);
  }
  if (cmGeneratorExpression::Find(src) != std::string::npos) {
    return nullptr;
  }
  return this->Makefile->GetOrCreateSource(src, false,
                                           cmSourceFileLocationKind::Known);
}